

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial_heap.cpp
# Opt level: O0

BiHeap binomial_heap_union(BiHeap *h1,BiHeap *h2)

{
  BiHeap p_Var1;
  BinomialNode *pBVar2;
  BinomialNode *local_40;
  BinomialNode *next;
  BinomialNode *x;
  BinomialNode *prev;
  BiHeap h;
  BiHeap *h2_local;
  BiHeap *h1_local;
  
  p_Var1 = binomial_heap_make();
  pBVar2 = binomial_heap_merge(*h1,*h2);
  p_Var1->head = pBVar2;
  free(*h1);
  *h1 = (BiHeap)0x0;
  free(*h2);
  *h2 = (BiHeap)0x0;
  if (p_Var1->head != (BinomialNode *)0x0) {
    x = (BinomialNode *)0x0;
    next = p_Var1->head;
    local_40 = next->sibling;
    while (local_40 != (BinomialNode *)0x0) {
      if ((next->degree == local_40->degree) &&
         ((local_40->sibling == (_BinomialNode *)0x0 || (next->degree != local_40->sibling->degree))
         )) {
        if (local_40->key < next->key) {
          if (x == (BinomialNode *)0x0) {
            p_Var1->head = local_40;
          }
          else {
            x->sibling = local_40;
          }
          binomial_link(next,local_40);
        }
        else {
          next->sibling = local_40->sibling;
          binomial_link(local_40,next);
        }
      }
      else {
        x = next;
        next = local_40;
      }
      local_40 = next->sibling;
    }
  }
  return p_Var1;
}

Assistant:

BiHeap binomial_heap_union(BiHeap *h1, BiHeap *h2) {
    BiHeap h = binomial_heap_make();
//    firstly merge two heaps
    h->head = binomial_heap_merge(*h1, *h2);
    free(*h1);
    *h1 = NULL;
    free(*h2);
    *h2 = NULL;
//    if the result is empty, ignore next steps
    if (h->head == NULL) {
        return h;
    }

    BinomialNode *prev = NULL;
    BinomialNode *x = h->head;
    BinomialNode *next = x->sibling;

//  travelling the root list, and merge the adjacent heaps which have same degree.
    while (next != NULL) {
        if (x->degree != next->degree
            || (next->sibling != NULL
                && x->degree == next->sibling->degree)) {
            // case 3 or case 2, just move forward
            prev = x;
            x = next;
        } else if (x->key <= next->key) {
            // x->key <= next->key
            x->sibling = next->sibling;
            binomial_link(next, x);
        } else {
            // x->key > next->key
            if (prev == NULL) {
                h->head = next;
            } else {
                prev->sibling = next;
            }
            binomial_link(x, next);
        }
        // change the next
        next = x->sibling;
    }
    return h;
}